

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
::PropagateResult(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>
                  *this,BasicFlatConverter *cvt,int i,double lb,double ub,Context ctx)

{
  Context other;
  bool bVar1;
  reference pCVar2;
  CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>
  *con;
  Error *this_00;
  Context ctx_local;
  
  ctx_local = ctx;
  pCVar2 = std::
           _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_*>
           ::operator[](&(this->cons_).
                         super__Deque_base<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container>_>
                         ._M_impl.super__Deque_impl_data._M_start,(long)i);
  other.value_ = (pCVar2->ctx_redef_).value_;
  if (other.value_ != CTX_NONE) {
    bVar1 = Context::IsSubsetOf(&ctx_local,other);
    if (!bVar1) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x367cc4,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
  }
  con = GetConstraint(this,i);
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)cvt,con,lb,ub,ctx_local);
  return;
}

Assistant:

void PropagateResult(BasicFlatConverter& cvt,
                       int i,
                       double lb, double ub, Context ctx) override {
    try {
      // Too strong: instead, differentiate context
      // in which the redefinition happened #248.
      // MP_ASSERT_ALWAYS(ctx.IsSubsetOf(GetContext())
      //                  || IsBridgingToBeConsidered(i),
      auto ctx_redef = cons_[i].GetRedefContext();
      MP_ASSERT_ALWAYS(ctx_redef.IsNone()
                           || ctx.IsSubsetOf(ctx_redef),
                       "Part of expression redefinition\n"
                       "could be lost. Please contact\n"
                       "AMPL customer support.");
      static_cast<Converter&>(cvt).PropagateResult(
            GetConstraint(i), lb, ub, ctx);
    } catch (const std::exception& exc) {
      MP_RAISE(Converter::GetTypeName() +
               std::string(": propagating result for constraint ") +
               std::to_string(i) + "\nof type '" +
               Constraint::GetTypeName() +
               "':\n" + exc.what());
    }
  }